

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cc
# Opt level: O3

void __thiscall
iqxmlrpc::anon_unknown_0::Http_server_connection::log_exception
          (Http_server_connection *this,exception *ex)

{
  string s;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"iqxmlrpc::Http_server_connection: ","");
  (**(code **)(*(long *)ex + 0x10))(ex);
  std::__cxx11::string::append((char *)&local_40);
  Server::log_err_msg((this->super_Server_connection).server,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Http_server_connection::log_exception( const std::exception& ex )
{
  std::string s( "iqxmlrpc::Http_server_connection: " );
  s += ex.what();
  server->log_err_msg( s );
}